

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O2

void LenPriceEnc_UpdateTables(CLenPriceEnc *p,uint numPosStates,CLenEnc *enc,CProbPrice *ProbPrices)

{
  UInt32 startPrice;
  int iVar1;
  CProbPrice CVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  UInt32 *pUVar10;
  UInt32 *local_50;
  
  uVar5 = enc->low[0] >> 2 & 0xfffffffc;
  startPrice = *(UInt32 *)((long)ProbPrices + (ulong)uVar5);
  iVar1 = *(int *)((long)ProbPrices + (ulong)(uVar5 ^ 0x1fc));
  CVar2 = ProbPrices[enc->low[8] >> 4];
  pUVar10 = p->prices[0] + 8;
  for (uVar9 = 0; (ulong)numPosStates << 4 != uVar9; uVar9 = uVar9 + 0x10) {
    SetPrices_3(enc->low + (uVar9 & 0xffffffff),startPrice,(UInt32 *)(pUVar10 + -8),ProbPrices);
    SetPrices_3(enc->low + (uVar9 & 0xffffffff) + 8,CVar2 + iVar1,pUVar10,ProbPrices);
    pUVar10 = pUVar10 + 0x110;
  }
  uVar5 = p->tableSize;
  if (0x10 < uVar5) {
    pUVar10 = p->prices[0] + 0x10;
    uVar9 = (ulong)(uVar5 - 0xf >> 1);
    iVar3 = *(int *)((long)ProbPrices + (ulong)(enc->low[8] >> 2 & 0xfffffffc ^ 0x1fc));
    do {
      iVar7 = iVar1 + iVar3;
      uVar6 = (int)uVar9 + 0x7f;
      do {
        iVar7 = iVar7 + ProbPrices
                        [(-(uVar6 & 1) & 0x7f0 ^
                         (uint)*(ushort *)((long)enc->high + (ulong)(uVar6 & 0xfffffffe))) >> 4];
        bVar4 = 3 < uVar6;
        uVar6 = uVar6 >> 1;
      } while (bVar4);
      uVar6 = (int)uVar9 - 1;
      uVar9 = (ulong)uVar6;
      uVar8 = enc->high[uVar9 + 0x80] >> 2 & 0xfffffffc;
      pUVar10[uVar9 * 2] = *(int *)((long)ProbPrices + (ulong)uVar8) + iVar7;
      p->prices[0][uVar9 * 2 + 0x11] = iVar7 + *(int *)((long)ProbPrices + (ulong)(uVar8 ^ 0x1fc));
    } while (uVar6 != 0);
    local_50 = p->prices[1] + 0x10;
    for (uVar9 = 1; uVar9 < numPosStates; uVar9 = uVar9 + 1) {
      memcpy(local_50,pUVar10,(ulong)(uVar5 - 0x10) << 2);
      local_50 = local_50 + 0x110;
    }
  }
  return;
}

Assistant:

Z7_FASTCALL LenPriceEnc_UpdateTables(
    CLenPriceEnc *p,
    unsigned numPosStates,
    const CLenEnc *enc,
    const CProbPrice *ProbPrices)
{
  UInt32 b;
 
  {
    unsigned prob = enc->low[0];
    UInt32 a, c;
    unsigned posState;
    b = GET_PRICEa_1(prob);
    a = GET_PRICEa_0(prob);
    c = b + GET_PRICEa_0(enc->low[kLenNumLowSymbols]);
    for (posState = 0; posState < numPosStates; posState++)
    {
      UInt32 *prices = p->prices[posState];
      const CLzmaProb *probs = enc->low + (posState << (1 + kLenNumLowBits));
      SetPrices_3(probs, a, prices, ProbPrices);
      SetPrices_3(probs + kLenNumLowSymbols, c, prices + kLenNumLowSymbols, ProbPrices);
    }
  }

  /*
  {
    unsigned i;
    UInt32 b;
    a = GET_PRICEa_0(enc->low[0]);
    for (i = 0; i < kLenNumLowSymbols; i++)
      p->prices2[i] = a;
    a = GET_PRICEa_1(enc->low[0]);
    b = a + GET_PRICEa_0(enc->low[kLenNumLowSymbols]);
    for (i = kLenNumLowSymbols; i < kLenNumLowSymbols * 2; i++)
      p->prices2[i] = b;
    a += GET_PRICEa_1(enc->low[kLenNumLowSymbols]);
  }
  */
 
  // p->counter = numSymbols;
  // p->counter = 64;

  {
    unsigned i = p->tableSize;
    
    if (i > kLenNumLowSymbols * 2)
    {
      const CLzmaProb *probs = enc->high;
      UInt32 *prices = p->prices[0] + kLenNumLowSymbols * 2;
      i -= kLenNumLowSymbols * 2 - 1;
      i >>= 1;
      b += GET_PRICEa_1(enc->low[kLenNumLowSymbols]);
      do
      {
        /*
        p->prices2[i] = a +
        // RcTree_GetPrice(enc->high, kLenNumHighBits, i - kLenNumLowSymbols * 2, ProbPrices);
        LitEnc_GetPrice(probs, i - kLenNumLowSymbols * 2, ProbPrices);
        */
        // UInt32 price = a + RcTree_GetPrice(probs, kLenNumHighBits - 1, sym, ProbPrices);
        unsigned sym = --i + (1 << (kLenNumHighBits - 1));
        UInt32 price = b;
        do
        {
          const unsigned bit = sym & 1;
          sym >>= 1;
          price += GET_PRICEa(probs[sym], bit);
        }
        while (sym >= 2);

        {
          const unsigned prob = probs[(size_t)i + (1 << (kLenNumHighBits - 1))];
          prices[(size_t)i * 2    ] = price + GET_PRICEa_0(prob);
          prices[(size_t)i * 2 + 1] = price + GET_PRICEa_1(prob);
        }
      }
      while (i);

      {
        unsigned posState;
        const size_t num = (p->tableSize - kLenNumLowSymbols * 2) * sizeof(p->prices[0][0]);
        for (posState = 1; posState < numPosStates; posState++)
          memcpy(p->prices[posState] + kLenNumLowSymbols * 2, p->prices[0] + kLenNumLowSymbols * 2, num);
      }
    }
  }
}